

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umsg.cpp
# Opt level: O0

int32_t umsg_toPattern_63(UMessageFormat *fmt,UChar *result,int32_t resultLength,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  Char16Ptr local_88 [3];
  undefined1 local_70 [8];
  UnicodeString res;
  UErrorCode *status_local;
  int32_t resultLength_local;
  UChar *result_local;
  UMessageFormat *fmt_local;
  
  if ((status == (UErrorCode *)0x0) ||
     (res.fUnion._48_8_ = status, UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    return -1;
  }
  if (((fmt != (UMessageFormat *)0x0) && (-1 < resultLength)) &&
     ((resultLength < 1 || (result != (UChar *)0x0)))) {
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_70);
    if ((result != (UChar *)0x0) || (resultLength != 0)) {
      icu_63::UnicodeString::setTo((UnicodeString *)local_70,result,0,resultLength);
    }
    (**(code **)((long)*fmt + 0x68))(fmt,local_70);
    icu_63::Char16Ptr::Char16Ptr(local_88,result);
    iVar2 = icu_63::UnicodeString::extract
                      ((UnicodeString *)local_70,local_88,resultLength,
                       (UErrorCode *)res.fUnion._48_8_);
    icu_63::Char16Ptr::~Char16Ptr(local_88);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_70);
    return iVar2;
  }
  *(undefined4 *)res.fUnion._48_8_ = 1;
  return -1;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
umsg_toPattern(const UMessageFormat *fmt,
               UChar* result, 
               int32_t resultLength,
               UErrorCode* status)
{
    //check arguments
    if(status ==NULL||U_FAILURE(*status)){
        return -1;
    }
    if(fmt==NULL||resultLength<0 || (resultLength>0 && result==0)){
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
    }


    UnicodeString res;
    if(!(result==NULL && resultLength==0)) {
        // NULL destination for pure preflighting: empty dummy string
        // otherwise, alias the destination buffer
        res.setTo(result, 0, resultLength);
    }
    ((const MessageFormat*)fmt)->toPattern(res);
    return res.extract(result, resultLength, *status);
}